

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void __thiscall
Qentem::QTest::PrintErrorMessage<char[5],char[5]>
          (QTest *this,bool equal,char (*value1) [5],char (*value2) [5],unsigned_long line)

{
  undefined7 in_register_00000031;
  wostream *pwVar1;
  char *pcVar2;
  char local_41;
  char *local_40;
  char *local_38;
  
  local_38 = TestOutPut::GetColor(ERROR);
  local_40 = TestOutPut::GetColor(END);
  local_41 = '\n';
  TestOutPut::Print<char_const*,char[7],char_const*,char[3],char_const*,char>
            (&local_38,(char (*) [7])"Failed",&local_40,(char (*) [3])0x107112,&this->part_name_,
             &local_41);
  pcVar2 = " ";
  if ((int)CONCAT71(in_register_00000031,equal) != 0) {
    pcVar2 = " not ";
  }
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar1 = (wostream *)&std::wcout;
  }
  else {
    pwVar1 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  }
  pwVar1 = std::operator<<(pwVar1,this->file_fullname_);
  pwVar1 = std::operator<<(pwVar1,":");
  pwVar1 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar1);
  pwVar1 = std::operator<<(pwVar1,":\n Should");
  pwVar1 = std::operator<<(pwVar1,pcVar2);
  pwVar1 = std::operator<<(pwVar1,"equal: `");
  pwVar1 = std::operator<<(pwVar1,*value2);
  pwVar1 = std::operator<<(pwVar1,"`\n     Returned: `");
  pwVar1 = std::operator<<(pwVar1,*value1);
  std::operator<<(pwVar1,"`\n\n");
  return;
}

Assistant:

QENTEM_NOINLINE void PrintErrorMessage(bool equal, const Value1_T &value1, const Value2_T &value2,
                                           unsigned long line) {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Failed",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        TestOutPut::Print(file_fullname_, ":", line, ":\n Should", (equal ? " not " : " "), "equal: `", value2,
                          "`\n     Returned: `", value1, "`\n\n");
    }